

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O2

void __thiscall Gluco::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  Queue<unsigned_int> *this_00;
  ClauseAllocator *this_01;
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  uint *puVar3;
  ulong *puVar4;
  vec<unsigned_int> *pvVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int i;
  undefined8 uStack_38;
  
  if (this->n_touched != 0) {
    this_00 = &this->subsumption_queue;
    this_01 = &(this->super_Solver).ca;
    iVar7 = 0;
    uStack_38 = in_RAX;
    while( true ) {
      iVar1 = (this->subsumption_queue).end;
      iVar6 = 0;
      iVar2 = (this->subsumption_queue).first;
      if (iVar1 < iVar2) {
        iVar6 = (this->subsumption_queue).buf.sz;
      }
      if ((iVar1 - iVar2) + iVar6 <= iVar7) break;
      puVar3 = Queue<unsigned_int>::operator[](this_00,iVar7);
      puVar3 = RegionAllocator<unsigned_int>::operator[]
                         (&this_01->super_RegionAllocator<unsigned_int>,*puVar3);
      if ((*puVar3 & 3) == 0) {
        puVar3 = Queue<unsigned_int>::operator[](this_00,iVar7);
        puVar4 = (ulong *)RegionAllocator<unsigned_int>::operator[]
                                    (&this_01->super_RegionAllocator<unsigned_int>,*puVar3);
        *puVar4 = *puVar4 & 0xfffffffffffffffc | 2;
      }
      iVar7 = iVar7 + 1;
    }
    for (iVar7 = 0; uStack_38 = CONCAT44(iVar7,(undefined4)uStack_38), iVar7 < (this->touched).sz;
        iVar7 = iVar7 + 1) {
      if ((this->touched).data[iVar7] != '\0') {
        pvVar5 = OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::lookup
                           (&this->occurs,(int *)((long)&uStack_38 + 4));
        for (lVar8 = 0; lVar8 < pvVar5->sz; lVar8 = lVar8 + 1) {
          puVar3 = RegionAllocator<unsigned_int>::operator[]
                             (&this_01->super_RegionAllocator<unsigned_int>,pvVar5->data[lVar8]);
          if ((*puVar3 & 3) == 0) {
            Queue<unsigned_int>::insert(this_00,pvVar5->data[lVar8]);
            puVar4 = (ulong *)RegionAllocator<unsigned_int>::operator[]
                                        (&this_01->super_RegionAllocator<unsigned_int>,
                                         pvVar5->data[lVar8]);
            *puVar4 = *puVar4 & 0xfffffffffffffffc | 2;
          }
        }
        (this->touched).data[uStack_38._4_4_] = '\0';
        iVar7 = uStack_38._4_4_;
      }
    }
    iVar7 = 0;
    while( true ) {
      uStack_38 = CONCAT44(iVar7,(undefined4)uStack_38);
      iVar1 = (this->subsumption_queue).end;
      iVar6 = 0;
      iVar2 = (this->subsumption_queue).first;
      if (iVar1 < iVar2) {
        iVar6 = (this->subsumption_queue).buf.sz;
      }
      if ((iVar1 - iVar2) + iVar6 <= iVar7) break;
      puVar3 = Queue<unsigned_int>::operator[](this_00,iVar7);
      puVar3 = RegionAllocator<unsigned_int>::operator[]
                         (&this_01->super_RegionAllocator<unsigned_int>,*puVar3);
      if ((*puVar3 & 3) == 2) {
        puVar3 = Queue<unsigned_int>::operator[](this_00,uStack_38._4_4_);
        puVar3 = RegionAllocator<unsigned_int>::operator[]
                           (&this_01->super_RegionAllocator<unsigned_int>,*puVar3);
        *(byte *)puVar3 = (byte)*puVar3 & 0xfc;
      }
      iVar7 = uStack_38._4_4_ + 1;
    }
    this->n_touched = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i,j;
    for (i = j = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0)
            ca[subsumption_queue[i]].mark(2);

    for (i = 0; i < touched.size(); i++)
        if (touched[i]){
            const vec<CRef>& cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0){
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2)
            ca[subsumption_queue[i]].mark(0);

    n_touched = 0;
}